

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

double amrex::second(void)

{
  rep_conflict rVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffc8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffd0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffd8;
  duration<double,_std::ratio<1L,_1L>_> local_8;
  
  std::chrono::_V2::steady_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  local_8.__r = (rep_conflict)
                std::chrono::
                duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                          (in_stack_ffffffffffffffc8);
  rVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_8);
  return rVar1;
}

Assistant:

double amrex::second () noexcept
{
    return std::chrono::duration_cast<std::chrono::duration<double> >
        (amrex::MaxResSteadyClock::now() - clock_time_begin).count();
}